

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placeholder_impl.cpp
# Opt level: O1

void __thiscall ui::PlaceHolderImpl::~PlaceHolderImpl(PlaceHolderImpl *this)

{
  ~PlaceHolderImpl(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

PlaceHolderImpl(std::string title) : title_(title) {}